

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.h
# Opt level: O0

void __thiscall YAML::detail::node::node(node *this)

{
  node_ref *this_00;
  shared_ptr<YAML::detail::node_ref> *in_RDI;
  node_ref *in_stack_ffffffffffffffc8;
  shared_ptr<YAML::detail::node_ref> *this_01;
  
  this_01 = in_RDI;
  this_00 = (node_ref *)operator_new(0x10);
  node_ref::node_ref(this_00);
  std::shared_ptr<YAML::detail::node_ref>::shared_ptr<YAML::detail::node_ref,void>
            (this_01,in_stack_ffffffffffffffc8);
  memset(in_RDI + 1,0,0x30);
  std::set<YAML::detail::node_*,_YAML::detail::node::less,_std::allocator<YAML::detail::node_*>_>::
  set((set<YAML::detail::node_*,_YAML::detail::node::less,_std::allocator<YAML::detail::node_*>_> *)
      0xf06075);
  in_RDI[4].super___shared_ptr<YAML::detail::node_ref,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  return;
}

Assistant:

node() : m_pRef(new node_ref), m_dependencies{}, m_index{} {}